

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlHashedString xmlParseQNameHashed(xmlParserCtxtPtr ctxt,xmlHashedString *prefix)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  uint uVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *info1;
  xmlChar *pxVar6;
  ulong unaff_R12;
  xmlChar *pxVar7;
  xmlHashedString xVar8;
  
  pxVar4 = ctxt->input;
  if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar4 = ctxt->input;
  }
  pxVar6 = pxVar4->cur;
  pxVar2 = pxVar4->base;
  xVar8 = xmlParseNCName(ctxt);
  pxVar5 = xVar8.name;
  uVar3 = xVar8.hashValue;
  xVar1 = *ctxt->input->cur;
  if (pxVar5 == (xmlChar *)0x0) {
    if (xVar1 == ':') {
LAB_001416ce:
      pxVar5 = xmlParseNmtoken(ctxt);
      if (pxVar5 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5);
      }
      pxVar6 = ctxt->input->base + ((int)pxVar6 - (int)pxVar2);
      xVar8 = xmlDictLookupHashed(ctxt->dict,pxVar6,*(int *)&ctxt->input->cur - (int)pxVar6);
      info1 = xVar8.name;
      uVar3 = xVar8.hashValue;
      if (info1 != (xmlChar *)0x0) {
        xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s\'\n",info1,(xmlChar *)0x0,
                 (xmlChar *)0x0);
        pxVar7 = (xmlChar *)0x0;
        goto LAB_00141732;
      }
      xmlCtxtErrMemory(ctxt);
    }
    info1 = (xmlChar *)0x0;
  }
  else {
    if (xVar1 == ':') {
      xmlNextChar(ctxt);
      unaff_R12 = (ulong)uVar3;
      xVar8 = xmlParseNCName(ctxt);
      info1 = xVar8.name;
      if ((info1 == (xmlChar *)0x0) ||
         (uVar3 = xVar8.hashValue, pxVar7 = pxVar5, *ctxt->input->cur == ':')) goto LAB_001416ce;
    }
    else {
      pxVar7 = (xmlChar *)0x0;
      info1 = pxVar5;
    }
LAB_00141732:
    *(ulong *)prefix = unaff_R12;
    prefix->name = pxVar7;
  }
  xVar8._4_4_ = 0;
  xVar8.hashValue = uVar3;
  xVar8.name = info1;
  return xVar8;
}

Assistant:

static xmlHashedString
xmlParseQNameHashed(xmlParserCtxtPtr ctxt, xmlHashedString *prefix) {
    xmlHashedString l, p;
    int start, isNCName = 0;

    l.name = NULL;
    p.name = NULL;

    GROW;
    start = CUR_PTR - BASE_PTR;

    l = xmlParseNCName(ctxt);
    if (l.name != NULL) {
        isNCName = 1;
        if (CUR == ':') {
            NEXT;
            p = l;
            l = xmlParseNCName(ctxt);
        }
    }
    if ((l.name == NULL) || (CUR == ':')) {
        xmlChar *tmp;

        l.name = NULL;
        p.name = NULL;
        if ((isNCName == 0) && (CUR != ':'))
            return(l);
        tmp = xmlParseNmtoken(ctxt);
        if (tmp != NULL)
            xmlFree(tmp);
        l = xmlDictLookupHashed(ctxt->dict, BASE_PTR + start,
                                CUR_PTR - (BASE_PTR + start));
        if (l.name == NULL) {
            xmlErrMemory(ctxt);
            return(l);
        }
        xmlNsErr(ctxt, XML_NS_ERR_QNAME,
                 "Failed to parse QName '%s'\n", l.name, NULL, NULL);
    }

    *prefix = p;
    return(l);
}